

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O0

void flesh_two(CHAR_DATA *ch,CHAR_DATA *victim)

{
  long in_RDI;
  char_data **in_stack_00000098;
  _func_void_char_data_ptr_char_data_ptr *in_stack_000000a0;
  string *in_stack_000000a8;
  string *in_stack_000000b0;
  int in_stack_000000bc;
  CQueue *in_stack_000000c0;
  char_data **in_stack_000000d0;
  void *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *format;
  allocator<char> local_69;
  string local_68 [8];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_31;
  string local_30 [40];
  long local_8;
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    format = (char *)0x0;
    act((char *)0x0,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0)
    ;
    act(format,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    CQueue::AddToQueue<void(*)(char_data*,char_data*),char_data*&,char_data*&>
              (in_stack_000000c0,in_stack_000000bc,in_stack_000000b0,in_stack_000000a8,
               in_stack_000000a0,in_stack_00000098,in_stack_000000d0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    local_8 = in_RDI;
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    *(undefined1 *)(local_8 + 0x32c) = 1;
  }
  return;
}

Assistant:

void flesh_two(CHAR_DATA *ch, CHAR_DATA *victim)
{
	if (ch->fighting)
	{
		send_to_char("The unholy ritual disrupted, the harnessed energy dissipates harmlessly.\n\r", ch);
		ch->disrupted = true;
		return;
	}

	act("$n pours blood onto the floor, chanting softly in an undecipherable tongue.", ch, 0, 0, TO_ROOM);
	act("You pour blood onto the floor, chanting softly in an arcane tongue.", ch, 0, 0, TO_CHAR);

	RS.Queue.AddToQueue(3, "flesh_two", "flesh_three", flesh_three, ch, victim);
}